

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

void __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
::
emplace<int_density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_put_samples(std::ostream&)::Struct::*,int_density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_put_samples(std::ostream&)::Struct::*>
          (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
           *this,offset_in_Struct_to_int *i_construction_params)

{
  put_transaction<int_Struct::*> pStack_28;
  
  start_emplace<int_density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_put_samples(std::ostream&)::Struct::*,int_density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>::func_queue_put_samples(std::ostream&)::Struct::*>
            (&pStack_28,this,i_construction_params);
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::put_transaction<int_Struct::*>::commit(&pStack_28);
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::put_transaction<int_Struct::*>::~put_transaction(&pStack_28);
  return;
}

Assistant:

void emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            start_emplace<ELEMENT_TYPE>(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)
              .commit();
        }